

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  int iVar1;
  bool bVar2;
  
  if (*(string **)(*(ulong *)(file + 8) + 8) < (string *)package_name->_M_string_length) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    iVar1 = std::__cxx11::string::compare
                      (*(ulong *)(file + 8),0,(string *)package_name->_M_string_length);
    if (iVar1 == 0) {
      bVar2 = true;
      if ((*(long **)(file + 8))[1] != package_name->_M_string_length) {
        bVar2 = *(char *)(**(long **)(file + 8) + package_name->_M_string_length) == '.';
      }
    }
  }
  return bVar2;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
           (file->package().size() == package_name.size() ||
            file->package()[package_name.size()] == '.');
}